

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void CheckAREA(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  AttVal *attval;
  AttVal *pAVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_ALT);
  pAVar3 = prvTidyAttrGetById(node,TidyAttr_HREF);
  pAVar4 = prvTidyAttrGetById(node,TidyAttr_NOHREF);
  attval = node->attributes;
  while (attval != (AttVal *)0x0) {
    pAVar1 = attval->next;
    prvTidyCheckAttribute(doc,node,attval);
    attval = pAVar1;
  }
  if ((pAVar2 == (AttVal *)0x0) && ((doc->config).value[1].v == 0)) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 2;
    prvTidyReportMissingAttr(doc,node,"alt");
  }
  if (pAVar3 == (AttVal *)0x0 && pAVar4 == (AttVal *)0x0) {
    prvTidyReportMissingAttr(doc,node,"href");
    return;
  }
  return;
}

Assistant:

void CheckAREA( TidyDocImpl* doc, Node *node )
{
    Bool HasAlt = TY_(AttrGetById)(node, TidyAttr_ALT) != NULL;
    Bool HasHref = TY_(AttrGetById)(node, TidyAttr_HREF) != NULL;
    Bool HasNohref = TY_(AttrGetById)(node, TidyAttr_NOHREF) != NULL;

    TY_(CheckAttributes)(doc, node);

    if ( !HasAlt )
    {
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |= BA_MISSING_LINK_ALT;
            TY_(ReportMissingAttr)( doc, node, "alt" );
        }
    }

    if ( !HasHref && !HasNohref )
        TY_(ReportMissingAttr)( doc, node, "href" );
}